

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
KickGameCommand::trigger
          (KickGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  PlayerInfo *pPVar1;
  char *pcVar2;
  undefined8 uVar3;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  char *in_R9;
  size_t sVar4;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  split_parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  undefined8 local_30;
  char *local_28;
  
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)0x13ab67;
  jessilib::
  word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
            (&local_70,(jessilib *)parameters._M_str,
             (char *)((jessilib *)parameters._M_str + parameters._M_len)," \t","",in_R9);
  if (local_70.first._M_len == 0) {
    pcVar2 = "Error: Too few parameters. Syntax: kick <player> [Reason]";
    uVar3 = 0x39;
  }
  else {
    pcVar2 = "No reason";
    if (local_70.second._M_len != 0) {
      pcVar2 = local_70.second._M_str;
    }
    sVar4 = 9;
    if (local_70.second._M_len != 0) {
      sVar4 = local_70.second._M_len;
    }
    pPVar1 = (PlayerInfo *)
             RenX::Server::getPlayerByPartName(source,local_70.first._M_len,local_70.first._M_str);
    if (pPVar1 == (PlayerInfo *)0x0) {
      pcVar2 = "Error: Player not found.";
      uVar3 = 0x18;
    }
    else if (pPVar1 == player) {
      pcVar2 = "Error: You cannot kick yourself.";
      uVar3 = 0x20;
    }
    else {
      if (player->access <= pPVar1->access) {
        local_30 = 0x25;
        local_28 = "Error: You can not kick higher level ";
        local_40._M_len = pluginInstance.m_staffTitle._M_string_length;
        local_40._M_str = pluginInstance.m_staffTitle._M_dataplus._M_p;
        local_50._M_len = 2;
        local_50._M_str = "s.";
        jessilib::
        join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  (&local_90,(jessilib *)&local_30,&local_40,&local_50,args_2);
        RenX::Server::sendMessage(source,player,local_90._M_string_length,local_90._M_dataplus._M_p)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p == &local_90.field_2) {
          return;
        }
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        return;
      }
      RenX::Server::kickPlayer(source,pPVar1,sVar4,pcVar2);
      pcVar2 = "Player has been kicked from the game.";
      uVar3 = 0x25;
    }
  }
  RenX::Server::sendMessage(source,player,uVar3,pcVar2);
  return;
}

Assistant:

void KickGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	auto split_parameters = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!split_parameters.first.empty()) {
		std::string_view reason = split_parameters.second;
		if (reason.empty()) {
			reason = "No reason"sv;
		}

		RenX::PlayerInfo *target = source->getPlayerByPartName(split_parameters.first);
		if (target == nullptr) {
			source->sendMessage(*player, "Error: Player not found."sv);
		}
		else if (player == target) {
			source->sendMessage(*player, "Error: You cannot kick yourself."sv);
		}
		else if (target->access >= player->access) {
			source->sendMessage(*player, jessilib::join<std::string>("Error: You can not kick higher level "sv, pluginInstance.getStaffTitle(), "s."sv));
		}
		else
		{
			source->kickPlayer(*target, reason);
			source->sendMessage(*player, "Player has been kicked from the game."sv);
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: kick <player> [Reason]"sv);
}